

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FileDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FileDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint32 uVar6;
  size_t __n;
  void *__src;
  uint8 *puVar7;
  uint8 *target_00;
  EpsCopyOutputStream *in_RDX;
  uint8 *in_RSI;
  FileDescriptorProto *in_RDI;
  int n_6;
  int i_6;
  int n_5;
  int i_5;
  uint n_4;
  uint i_4;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  string *s;
  int n;
  int i;
  uint32 cached_has_bits;
  ptrdiff_t size;
  Operation in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  FileDescriptorProto *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  EpsCopyOutputStream *in_stack_fffffffffffffcc0;
  EpsCopyOutputStream *in_stack_fffffffffffffcc8;
  EpsCopyOutputStream *in_stack_fffffffffffffcd0;
  uint8 *in_stack_fffffffffffffcd8;
  EpsCopyOutputStream *in_stack_fffffffffffffce0;
  EpsCopyOutputStream *in_stack_fffffffffffffcf8;
  uint8 *in_stack_fffffffffffffd00;
  EpsCopyOutputStream *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  uint local_2cc;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  uint uVar8;
  DescriptorProto *in_stack_fffffffffffffd48;
  int local_2a8;
  FileDescriptorProto *this_00;
  uint8 *local_230;
  
  uVar1 = (in_RDI->_has_bits_).has_bits_[0];
  local_230 = in_RSI;
  this_00 = in_RDI;
  if ((uVar1 & 1) != 0) {
    _internal_name_abi_cxx11_((FileDescriptorProto *)0x510141);
    in_stack_fffffffffffffd00 = (uint8 *)std::__cxx11::string::data();
    _internal_name_abi_cxx11_((FileDescriptorProto *)0x510158);
    std::__cxx11::string::length();
    in_stack_fffffffffffffd08 = in_RDX;
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8
               ,(char *)0x510178);
    in_RDX = in_stack_fffffffffffffd08;
    _internal_name_abi_cxx11_((FileDescriptorProto *)0x51018f);
    local_230 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffce0,
                           (uint32)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                           (string *)in_stack_fffffffffffffcd0,(uint8 *)in_stack_fffffffffffffcc8);
  }
  if ((uVar1 & 2) != 0) {
    _internal_package_abi_cxx11_((FileDescriptorProto *)0x5101ca);
    std::__cxx11::string::data();
    _internal_package_abi_cxx11_((FileDescriptorProto *)0x5101e1);
    std::__cxx11::string::length();
    in_stack_fffffffffffffcf8 = in_RDX;
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8
               ,(char *)0x510201);
    in_RDX = in_stack_fffffffffffffcf8;
    _internal_package_abi_cxx11_((FileDescriptorProto *)0x510218);
    local_230 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffce0,
                           (uint32)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                           (string *)in_stack_fffffffffffffcd0,(uint8 *)in_stack_fffffffffffffcc8);
  }
  local_2a8 = 0;
  iVar3 = _internal_dependency_size((FileDescriptorProto *)0x51024f);
  for (; local_2a8 < iVar3; local_2a8 = local_2a8 + 1) {
    in_stack_fffffffffffffd48 =
         (DescriptorProto *)
         _internal_dependency_abi_cxx11_(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    in_stack_fffffffffffffcd8 = (uint8 *)std::__cxx11::string::data();
    std::__cxx11::string::length();
    in_stack_fffffffffffffce0 = in_RDX;
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8
               ,(char *)0x5102ba);
    in_RDX = in_stack_fffffffffffffce0;
    __n = std::__cxx11::string::size();
    bVar2 = true;
    if ((long)__n < 0x80) {
      in_stack_fffffffffffffcd0 =
           (EpsCopyOutputStream *)(in_stack_fffffffffffffce0->end_ + (0x10 - (long)local_230));
      iVar4 = io::EpsCopyOutputStream::TagSize(0x18);
      bVar2 = (long)in_stack_fffffffffffffcd0 + (-1 - (long)iVar4) < (long)__n;
    }
    if (bVar2) {
      local_230 = io::EpsCopyOutputStream::WriteStringOutline
                            (in_stack_fffffffffffffcc8,
                             (uint32)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
                             in_stack_fffffffffffffcb8,(uint8 *)in_stack_fffffffffffffcb0);
    }
    else {
      *local_230 = '\x1a';
      local_230[1] = (uint8)__n;
      in_stack_fffffffffffffcc8 = (EpsCopyOutputStream *)(local_230 + 2);
      __src = (void *)std::__cxx11::string::data();
      memcpy(in_stack_fffffffffffffcc8,__src,__n);
      local_230 = ((EpsCopyOutputStream *)(local_230 + 2))->buffer_ + (__n - 0x10);
    }
  }
  uVar8 = 0;
  uVar5 = _internal_message_type_size((FileDescriptorProto *)0x5105b3);
  for (; uVar8 < uVar5; uVar8 = uVar8 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    _internal_message_type(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    uVar6 = internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar6,local_230);
    uVar6 = DescriptorProto::GetCachedSize((DescriptorProto *)0x5106a8);
    io::CodedOutputStream::WriteVarint32ToArray(uVar6,puVar7);
    local_230 = DescriptorProto::InternalSerializeWithCachedSizesToArray
                          (in_stack_fffffffffffffd48,(uint8 *)CONCAT44(uVar8,uVar5),
                           (EpsCopyOutputStream *)
                           CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  }
  uVar8 = 0;
  uVar5 = _internal_enum_type_size((FileDescriptorProto *)0x51070f);
  for (; uVar8 < uVar5; uVar8 = uVar8 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    _internal_enum_type(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    uVar6 = internal::WireFormatLite::MakeTag(5,WIRETYPE_LENGTH_DELIMITED);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar6,local_230);
    uVar6 = EnumDescriptorProto::GetCachedSize((EnumDescriptorProto *)0x510804);
    io::CodedOutputStream::WriteVarint32ToArray(uVar6,puVar7);
    local_230 = EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
                          ((EnumDescriptorProto *)
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                           (EpsCopyOutputStream *)
                           CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  }
  local_2cc = 0;
  uVar5 = _internal_service_size((FileDescriptorProto *)0x51086b);
  for (; local_2cc < uVar5; local_2cc = local_2cc + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    _internal_service(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    uVar6 = internal::WireFormatLite::MakeTag(6,WIRETYPE_LENGTH_DELIMITED);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar6,local_230);
    uVar6 = ServiceDescriptorProto::GetCachedSize((ServiceDescriptorProto *)0x510960);
    io::CodedOutputStream::WriteVarint32ToArray(uVar6,puVar7);
    local_230 = ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray
                          ((ServiceDescriptorProto *)in_stack_fffffffffffffce0,
                           in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  }
  uVar8 = 0;
  uVar5 = _internal_extension_size((FileDescriptorProto *)0x5109c7);
  for (; uVar8 < uVar5; uVar8 = uVar8 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    _internal_extension(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    uVar6 = internal::WireFormatLite::MakeTag(7,WIRETYPE_LENGTH_DELIMITED);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar6,local_230);
    uVar6 = FieldDescriptorProto::GetCachedSize((FieldDescriptorProto *)0x510abc);
    io::CodedOutputStream::WriteVarint32ToArray(uVar6,puVar7);
    local_230 = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
                          ((FieldDescriptorProto *)
                           CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                           (EpsCopyOutputStream *)in_RDI);
  }
  if ((uVar1 & 8) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    _Internal::options(in_RDI);
    puVar7 = local_230;
    uVar6 = internal::WireFormatLite::MakeTag(8,WIRETYPE_LENGTH_DELIMITED);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar6,local_230);
    uVar6 = FileOptions::GetCachedSize((FileOptions *)0x510bf4);
    io::CodedOutputStream::WriteVarint32ToArray(uVar6,target_00);
    local_230 = FileOptions::InternalSerializeWithCachedSizesToArray
                          ((FileOptions *)this_00,puVar7,in_RDX);
  }
  if ((uVar1 & 0x10) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    _Internal::source_code_info(in_RDI);
    uVar6 = internal::WireFormatLite::MakeTag(9,WIRETYPE_LENGTH_DELIMITED);
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar6,local_230);
    uVar6 = SourceCodeInfo::GetCachedSize((SourceCodeInfo *)0x510d16);
    io::CodedOutputStream::WriteVarint32ToArray(uVar6,puVar7);
    local_230 = SourceCodeInfo::InternalSerializeWithCachedSizesToArray
                          ((SourceCodeInfo *)in_stack_fffffffffffffcd0,
                           (uint8 *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  }
  iVar4 = 0;
  iVar3 = _internal_public_dependency_size((FileDescriptorProto *)0x510d64);
  for (; iVar4 < iVar3; iVar4 = iVar4 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    _internal_public_dependency(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    uVar6 = internal::WireFormatLite::MakeTag(10,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar6,local_230);
    local_230 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  }
  iVar4 = 0;
  iVar3 = _internal_weak_dependency_size((FileDescriptorProto *)0x510e8a);
  for (; uVar6 = (uint32)((ulong)in_stack_fffffffffffffcd8 >> 0x20), iVar4 < iVar3;
      iVar4 = iVar4 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffcb0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    _internal_weak_dependency(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    uVar6 = internal::WireFormatLite::MakeTag(0xb,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar6,local_230);
    local_230 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  }
  if ((uVar1 & 4) != 0) {
    _internal_syntax_abi_cxx11_((FileDescriptorProto *)0x510fb7);
    std::__cxx11::string::data();
    _internal_syntax_abi_cxx11_((FileDescriptorProto *)0x510fce);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8
               ,(char *)0x510fee);
    _internal_syntax_abi_cxx11_((FileDescriptorProto *)0x511005);
    local_230 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          (in_stack_fffffffffffffce0,uVar6,(string *)in_stack_fffffffffffffcd0,
                           (uint8 *)in_stack_fffffffffffffcc8);
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_230 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                           in_stack_fffffffffffffcf8);
  }
  return local_230;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FileDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_package().data(), static_cast<int>(this->_internal_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->_internal_dependency_size(); i < n; i++) {
    const auto& s = this->_internal_dependency(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_message_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(4, this->_internal_message_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(5, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_service_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(6, this->_internal_service(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(7, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        8, _Internal::options(this), target, stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        9, _Internal::source_code_info(this), target, stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->_internal_public_dependency_size(); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->_internal_weak_dependency_size(); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_weak_dependency(i), target);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_syntax().data(), static_cast<int>(this->_internal_syntax().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_syntax(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}